

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::FieldOptions_FeatureSupport::_InternalSerialize
          (FieldOptions_FeatureSupport *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  string_view s;
  FieldOptions_FeatureSupport *this_00;
  bool bVar1;
  Edition EVar2;
  int size;
  uint32_t *puVar3;
  char *data;
  UnknownFieldSet *unknown_fields;
  string_view local_48;
  string *local_38;
  string *_s;
  FieldOptions_FeatureSupport *pFStack_28;
  uint32_t cached_has_bits;
  FieldOptions_FeatureSupport *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  FieldOptions_FeatureSupport *this_local;
  
  _s._4_4_ = 0;
  pFStack_28 = this;
  this_ = (FieldOptions_FeatureSupport *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar3;
  if ((_s._4_4_ & 2) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    EVar2 = _internal_edition_introduced(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(1,EVar2,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 4) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    EVar2 = _internal_edition_deprecated(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(2,EVar2,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_deprecation_warning_abi_cxx11_(pFStack_28);
    data = (char *)std::__cxx11::string::data();
    size = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"google.protobuf.FieldOptions.FeatureSupport.deprecation_warning");
    internal::WireFormat::VerifyUTF8StringNamedField(data,size,SERIALIZE,local_48);
    this_00 = this_;
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)this_00,3,s,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 8) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    EVar2 = _internal_edition_removed(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(4,EVar2,(uint8_t *)stream_local);
  }
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(pFStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pFStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FieldOptions_FeatureSupport::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FieldOptions_FeatureSupport& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldOptions.FeatureSupport)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .google.protobuf.Edition edition_introduced = 1;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_edition_introduced(), target);
  }

  // optional .google.protobuf.Edition edition_deprecated = 2;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        2, this_._internal_edition_deprecated(), target);
  }

  // optional string deprecation_warning = 3;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_deprecation_warning();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldOptions.FeatureSupport.deprecation_warning");
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  // optional .google.protobuf.Edition edition_removed = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_edition_removed(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldOptions.FeatureSupport)
  return target;
}